

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall ot::commissioner::Interpreter::Value::Value(Value *this,Error *aError)

{
  Error *aError_local;
  Value *this_local;
  
  Error::Error(&this->mError,aError);
  std::__cxx11::string::string((string *)&this->mData);
  return;
}

Assistant:

Interpreter::Value::Value(Error aError)
    : mError(aError)
{
}